

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O0

void ConnectFaces(SIBMesh *mesh)

{
  uint uVar1;
  uint32_t posB;
  uint32_t *puVar2;
  reference pvVar3;
  SIBEdge *pSVar4;
  SIBEdge *edge;
  uint32_t next;
  uint32_t i;
  uint32_t prev;
  uint32_t numPoints;
  uint32_t *idx;
  size_t faceIdx;
  size_t numFaces;
  SIBMesh *mesh_local;
  
  puVar2 = (uint32_t *)
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&mesh->faceStart);
  for (idx = (uint32_t *)0x0; idx < puVar2; idx = (uint32_t *)((long)idx + 1)) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&mesh->faceStart,(size_type)idx);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&mesh->idx,(ulong)*pvVar3);
    _prev = pvVar3 + 1;
    uVar1 = *pvVar3;
    next = _prev[(uVar1 - 1) * 3];
    for (edge._4_4_ = 0; edge._4_4_ < uVar1; edge._4_4_ = edge._4_4_ + 1) {
      posB = *_prev;
      pSVar4 = GetEdge(mesh,next,posB);
      if (pSVar4->faceA == 0xffffffff) {
        pSVar4->faceA = (uint32_t)idx;
      }
      else if (pSVar4->faceB == 0xffffffff) {
        pSVar4->faceB = (uint32_t)idx;
      }
      _prev = _prev + 3;
      next = posB;
    }
  }
  return;
}

Assistant:

static void ConnectFaces(SIBMesh* mesh)
{
    // Find faces connected to each edge.
    size_t numFaces = mesh->faceStart.size();
    for (size_t faceIdx=0;faceIdx<numFaces;faceIdx++)
    {
        uint32_t *idx = &mesh->idx[mesh->faceStart[faceIdx]];
        uint32_t numPoints = *idx++;
        uint32_t prev = idx[(numPoints-1)*N+POS];

        for (uint32_t i=0;i<numPoints;i++,idx+=N)
        {
            uint32_t next = idx[POS];

            // Find this edge.
            SIBEdge& edge = GetEdge(mesh, prev, next);

            // Link this face onto it.
            // This gives potentially undesirable normals when used
            // with non-2-manifold surfaces, but then so does Silo to begin with.
            if (edge.faceA == 0xffffffff)
                edge.faceA = static_cast<uint32_t>(faceIdx);
            else if (edge.faceB == 0xffffffff)
                edge.faceB = static_cast<uint32_t>(faceIdx);

            prev = next;
        }
    }
}